

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::to_map(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  csubstr *pcVar1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  NodeData *pNVar10;
  char msg [37];
  char local_c8 [72];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar7 = has_children(this,node);
  if (bVar7) {
    builtin_strncpy(local_c8,"check failed: (! has_children(node))",0x25);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x67d8;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x67d8) << 0x40);
    LVar4.name.str._0_4_ = 0x1f8f8a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_c8,0x25,LVar4,(this->m_callbacks).m_user_data);
  }
  sVar8 = parent(this,node);
  if (sVar8 != 0xffffffffffffffff) {
    bVar7 = has_parent(this,node);
    if (!bVar7) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x15;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = -0x76;
      local_c8[0x19] = -0x71;
      local_c8[0x1a] = '\x1f';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0023b518)
                ("check failed: has_parent(node)",0x1e,(anonymous_namespace)::s_default_callbacks);
    }
    uVar9 = this->m_cap;
    if (node == 0xffffffffffffffff || uVar9 <= node) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x7a;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = -0x76;
      local_c8[0x19] = -0x71;
      local_c8[0x1a] = '\x1f';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0023b518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar9 = this->m_cap;
    }
    pNVar10 = this->m_buf;
    uVar2 = pNVar10[node].m_parent;
    if ((uVar2 == 0xffffffffffffffff) || (uVar9 <= uVar2)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x7a;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = -0x76;
      local_c8[0x19] = -0x71;
      local_c8[0x1a] = '\x1f';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0023b518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar10 = this->m_buf;
    }
    if ((pNVar10[uVar2].m_type.type & MAP) == NOTYPE) {
      builtin_strncpy(local_c8 + 0x30,"_map(node))",0xc);
      builtin_strncpy(local_c8 + 0x20,"ONE || parent_is",0x10);
      builtin_strncpy(local_c8 + 0x10,"arent(node) == N",0x10);
      builtin_strncpy(local_c8,"check failed: (p",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_80 = 0;
      uStack_78 = 0x67d9;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar5 = ZEXT1224(ZEXT412(0x67d9) << 0x40);
      LVar6.name.str._0_4_ = 0x1f8f8a;
      LVar6.super_LineCol.offset = auVar5._0_8_;
      LVar6.super_LineCol.line = auVar5._8_8_;
      LVar6.super_LineCol.col = auVar5._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_c8,0x3c,LVar6,(this->m_callbacks).m_user_data);
    }
  }
  _check_next_flags(this,node,more_flags | KEYMAP);
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = -0x76;
    local_c8[0x19] = -0x71;
    local_c8[0x1a] = '\x1f';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar10 = this->m_buf;
  pNVar10[node].m_type.type = more_flags | KEYMAP;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = -0x76;
    local_c8[0x19] = -0x71;
    local_c8[0x1a] = '\x1f';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar10 = this->m_buf;
  }
  pNVar10[node].m_key.tag.str = (char *)0x0;
  pNVar10[node].m_key.tag.len = 0;
  pNVar10[node].m_key.scalar.str = key.str;
  pNVar10[node].m_key.scalar.len = key.len;
  pcVar1 = &pNVar10[node].m_key.anchor;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = -0x76;
    local_c8[0x19] = -0x71;
    local_c8[0x1a] = '\x1f';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar10 = this->m_buf;
  pcVar1 = &pNVar10[node].m_val.anchor;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  pcVar1 = &pNVar10[node].m_val.scalar;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  pNVar10[node].m_val.tag.str = (char *)0x0;
  pNVar10[node].m_val.tag.len = 0;
  return;
}

Assistant:

void Tree::to_map(size_t node, csubstr key, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _RYML_CB_ASSERT(m_callbacks, parent(node) == NONE || parent_is_map(node));
    _set_flags(node, KEY|MAP|more_flags);
    _p(node)->m_key = key;
    _p(node)->m_val.clear();
}